

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

bool __thiscall capnp::MessageBuilder::isCanonical(MessageBuilder *this)

{
  SegmentBuilder *segment_00;
  int nestingLimit;
  BuilderArena *this_00;
  SegmentReader *pSVar1;
  word *location;
  PointerReader local_50;
  word *local_30;
  word *readHead;
  SegmentBuilder *local_20;
  SegmentReader *segment;
  MessageBuilder *this_local;
  
  segment = (SegmentReader *)this;
  local_20 = getRootSegment(this);
  if (local_20 == (SegmentBuilder *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = arena(this);
    kj::Id<unsigned_int,_capnp::_::Segment>::Id
              ((Id<unsigned_int,_capnp::_::Segment> *)((long)&readHead + 4),1);
    pSVar1 = _::BuilderArena::tryGetSegment(this_00,readHead._4_4_);
    if (pSVar1 == (SegmentReader *)0x0) {
      local_30 = _::SegmentReader::getStartPtr(&local_20->super_SegmentReader);
      segment_00 = local_20;
      local_30 = local_30 + 1;
      location = _::SegmentReader::getStartPtr(&local_20->super_SegmentReader);
      nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
      _::PointerReader::getRoot
                (&local_50,&segment_00->super_SegmentReader,(CapTableReader *)0x0,location,
                 nestingLimit);
      this_local._7_1_ = _::PointerReader::isCanonical(&local_50,&local_30);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MessageBuilder::isCanonical() {
  _::SegmentReader *segment = getRootSegment();

  if (segment == NULL) {
    // The message has no segments
    return false;
  }

  if (arena()->tryGetSegment(_::SegmentId(1))) {
    // The message has more than one segment
    return false;
  }

  const word* readHead = segment->getStartPtr() + 1;
  return _::PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), kj::maxValue)
                                  .isCanonical(&readHead);
}